

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O3

uint8_t * __thiscall
edition_unittest::TestNestedGroupExtensionInnerExtension::_InternalSerialize
          (TestNestedGroupExtensionInnerExtension *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  WireFormatLite *this_00;
  ulong uVar1;
  undefined8 *puVar2;
  uint8_t *puVar3;
  char *in_R9;
  string_view s;
  string_view field_name;
  
  if ((undefined1  [16])((undefined1  [16])this->field_0 & (undefined1  [16])0x1) !=
      (undefined1  [16])0x0) {
    puVar2 = (undefined8 *)
             ((ulong)(this->field_0)._impl_.inner_name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
    this_00 = (WireFormatLite *)*puVar2;
    uVar1 = puVar2[1];
    field_name._M_str = in_R9;
    field_name._M_len = (size_t)"edition_unittest.TestNestedGroupExtensionInnerExtension.inner_name"
    ;
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (this_00,(char *)(uVar1 & 0xffffffff),1,0x42,field_name);
    s._M_str = (char *)this_00;
    s._M_len = uVar1;
    target = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased(stream,1,s,target);
  }
  uVar1 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar1 & 1) == 0) {
    return target;
  }
  puVar3 = google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                     ((UnknownFieldSet *)((uVar1 & 0xfffffffffffffffe) + 8),target,stream);
  return puVar3;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestNestedGroupExtensionInnerExtension::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestNestedGroupExtensionInnerExtension& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:edition_unittest.TestNestedGroupExtensionInnerExtension)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // string inner_name = 1;
  if ((cached_has_bits & 0x00000001u) != 0) {
    const ::absl::string_view _s = this_._internal_inner_name();
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
        _s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormatLite::SERIALIZE, "edition_unittest.TestNestedGroupExtensionInnerExtension.inner_name");
    target = stream->WriteStringMaybeAliased(1, _s, target);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:edition_unittest.TestNestedGroupExtensionInnerExtension)
  return target;
}